

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O3

void __thiscall
file_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t>::file_output_t
          (file_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t> *this,
          string *filename)

{
  invalid_argument *this_00;
  runtime_error *this_01;
  ofstream *this_02;
  string err_msg;
  ifstream f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  long local_228 [4];
  int aiStack_208 [122];
  
  (this->super_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t>).
  _vptr_output_t = (_func_int **)&PTR__file_output_t_00151ba8;
  this_02 = &this->outstream;
  std::ofstream::ofstream(this_02);
  std::ifstream::ifstream(local_228,(string *)filename,_S_in);
  if (*(int *)((long)aiStack_208 + *(long *)(local_228[0] + -0x18)) == 0) {
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_248,"The output file already exists, aborting.","");
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,(string *)&local_248);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::ofstream::open((string *)this_02,(_Ios_Openmode)filename);
  if (((&this->field_0x28)[*(long *)(*(long *)this_02 + -0x18)] & 5) == 0) {
    std::ifstream::~ifstream(local_228);
    return;
  }
  std::operator+(&local_248,"couldn\'t open file ",filename);
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,(string *)&local_248);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

file_output_t(const std::string filename) {

		std::ifstream f(filename);
		if (f.good()) {
			std::string err_msg = "The output file already exists, aborting.";
			throw std::invalid_argument(err_msg);
		}

		outstream.open(filename);
		if (outstream.fail()) {
			std::string err_msg = "couldn't open file " + filename;
			throw std::runtime_error(err_msg);
		}
	}